

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TeamCityOutputTest.cpp
# Opt level: O0

void __thiscall
TEST_TeamCityOutputTest_PrintTestIgnored_TestShell::
TEST_TeamCityOutputTest_PrintTestIgnored_TestShell
          (TEST_TeamCityOutputTest_PrintTestIgnored_TestShell *this)

{
  TEST_TeamCityOutputTest_PrintTestIgnored_TestShell *this_local;
  
  UtestShell::UtestShell(&this->super_UtestShell);
  (this->super_UtestShell)._vptr_UtestShell =
       (_func_int **)&PTR__TEST_TeamCityOutputTest_PrintTestIgnored_TestShell_003da660;
  return;
}

Assistant:

TEST(TeamCityOutputTest, PrintTestIgnored)
{
    const char* expected =
        "##teamcity[testStarted name='test']\n"
        "##teamcity[testIgnored name='test']\n"
        "##teamcity[testFinished name='test' duration='41']\n";

    IgnoredUtestShell* itst = new IgnoredUtestShell("group", "test", "file", 10);
    result->currentTestStarted(itst);
    millisTime = 41;
    result->currentTestEnded(itst);
    STRCMP_EQUAL(expected, mock->getOutput().asCharString());
    delete itst;
}